

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void test_mac_ssh_hmac_sha256(void)

{
  test_mac(&ssh_hmac_sha256);
  return;
}

Assistant:

static void test_hash(const ssh_hashalg *halg)
{
    ssh_hash *h = ssh_hash_new(halg);
    if (!h) {
        test_skipped = true;
        return;
    }

    size_t datalen = 256;
    uint8_t *data = snewn(datalen, uint8_t);
    uint8_t *hash = snewn(halg->hlen, uint8_t);

    for (size_t i = 0; i < looplimit(16); i++) {
        random_read(data, datalen);

        log_start();
        put_data(h, data, datalen);
        ssh_hash_final(h, hash);
        log_end();

        h = ssh_hash_new(halg);
    }

    sfree(data);
    sfree(hash);
    ssh_hash_free(h);
}